

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testURI.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  bool bVar5;
  char local_428 [8];
  char str [1024];
  int local_20;
  int local_1c;
  int arg;
  int i;
  char **argv_local;
  int argc_local;
  
  local_20 = 1;
  if (((1 < argc) && (argv[1] != (char *)0x0)) && (iVar1 = strcmp(argv[1],"--relative"), iVar1 == 0)
     ) {
    local_20 = 2;
    relative = relative + 1;
  }
  iVar1 = local_20;
  if (((local_20 < argc) && (argv[local_20] != (char *)0x0)) &&
     ((iVar2 = strcmp(argv[local_20],"-base"), iVar2 == 0 ||
      (iVar2 = strcmp(argv[local_20],"--base"), iVar2 == 0)))) {
    base = argv[local_20 + 1];
    iVar1 = local_20 + 1;
    if (base != (char *)0x0) {
      iVar1 = local_20 + 2;
    }
  }
  local_20 = iVar1;
  if (((local_20 < argc) && (argv[local_20] != (char *)0x0)) &&
     ((iVar1 = strcmp(argv[local_20],"-escape"), iVar1 == 0 ||
      (iVar1 = strcmp(argv[local_20],"--escape"), iVar1 == 0)))) {
    local_20 = local_20 + 1;
    escape = escape + 1;
  }
  if (((local_20 < argc) && (argv[local_20] != (char *)0x0)) &&
     ((iVar1 = strcmp(argv[local_20],"-debug"), iVar1 == 0 ||
      (iVar1 = strcmp(argv[local_20],"--debug"), iVar1 == 0)))) {
    local_20 = local_20 + 1;
    debug = debug + 1;
  }
  if (argv[local_20] == (char *)0x0) {
    while (pcVar3 = fgets(local_428,0x3ff,_stdin), pcVar3 != (char *)0x0) {
      sVar4 = strlen(local_428);
      local_1c = (int)sVar4;
      while( true ) {
        bVar5 = false;
        if ((((0 < local_1c) && (bVar5 = true, local_428[local_1c + -1] != '\n')) &&
            (bVar5 = true, local_428[local_1c + -1] != '\r')) &&
           (bVar5 = true, local_428[local_1c + -1] != ' ')) {
          bVar5 = local_428[local_1c + -1] == '\t';
        }
        if (!bVar5) break;
        local_1c = local_1c + -1;
        local_428[local_1c] = '\0';
      }
      handleURI(local_428);
    }
  }
  else {
    for (; argv[local_20] != (char *)0x0; local_20 = local_20 + 1) {
      handleURI(argv[local_20]);
    }
  }
  xmlMemoryDump();
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    int i, arg = 1;

    if ((argc > arg) && (argv[arg] != NULL) &&
	(!strcmp(argv[arg], "--relative"))) {
	arg++;
	relative++;
    }
    if ((argc > arg) && (argv[arg] != NULL) &&
	((!strcmp(argv[arg], "-base")) || (!strcmp(argv[arg], "--base")))) {
	arg++;
	base = argv[arg];
	if (base != NULL)
	    arg++;
    }
    if ((argc > arg) && (argv[arg] != NULL) &&
	((!strcmp(argv[arg], "-escape")) || (!strcmp(argv[arg], "--escape")))) {
	arg++;
	escape++;
    }
    if ((argc > arg) && (argv[arg] != NULL) &&
	((!strcmp(argv[arg], "-debug")) || (!strcmp(argv[arg], "--debug")))) {
	arg++;
	debug++;
    }
    if (argv[arg] == NULL) {
	char str[1024];

        while (1) {
	    /*
	     * read one line in string buffer.
	     */
	    if (fgets (&str[0], sizeof (str) - 1, stdin) == NULL)
	       break;

	    /*
	     * remove the ending spaces
	     */
	    i = strlen(str);
	    while ((i > 0) &&
		   ((str[i - 1] == '\n') || (str[i - 1] == '\r') ||
		    (str[i - 1] == ' ') || (str[i - 1] == '\t'))) {
		i--;
		str[i] = 0;
	    }
	    handleURI(str);
        }
    } else {
	while (argv[arg] != NULL) {
	    handleURI(argv[arg]);
	    arg++;
	}
    }
    xmlMemoryDump();
    return(0);
}